

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::deviceQueueFamilyProperties
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  TestStatus *pTVar3;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  long lVar4;
  ulong uVar5;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> queueProperties;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_1d0;
  TestStatus *local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  pTVar2 = context->m_testCtx->m_log;
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceQueueFamilyProperties(&local_1d0,vk,physicalDevice);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"device = ",9);
  local_1b8 = __return_storage_ptr__;
  Context::getPhysicalDevice(context);
  std::ostream::_M_insert<void_const*>(poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (local_1d0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1d0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar4 = 0;
    uVar5 = 0;
    do {
      local_1b0._0_8_ = pTVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": ",2);
      ::vk::operator<<((ostream *)poVar1,
                       (VkQueueFamilyProperties *)
                       ((long)&(local_1d0.
                                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start)->queueFlags + lVar4));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 < (ulong)(((long)local_1d0.
                                    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1d0.
                                    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"Querying queue properties succeeded","");
  pTVar3 = local_1b8;
  local_1b8->m_code = QP_TEST_RESULT_PASS;
  (local_1b8->m_description)._M_dataplus._M_p = (pointer)&(local_1b8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8->m_description,local_1b0._0_8_,
             (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
  if ((TestLog *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
  }
  if (local_1d0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.
                    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar3;
}

Assistant:

tcu::TestStatus deviceQueueFamilyProperties (Context& context)
{
	TestLog&								log					= context.getTestContext().getLog();
	const vector<VkQueueFamilyProperties>	queueProperties		= getPhysicalDeviceQueueFamilyProperties(context.getInstanceInterface(), context.getPhysicalDevice());

	log << TestLog::Message << "device = " << context.getPhysicalDevice() << TestLog::EndMessage;

	for (size_t queueNdx = 0; queueNdx < queueProperties.size(); queueNdx++)
		log << TestLog::Message << queueNdx << ": " << queueProperties[queueNdx] << TestLog::EndMessage;

	return tcu::TestStatus::pass("Querying queue properties succeeded");
}